

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::Rectify::backward_impl
          (Rectify *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar8 = (ulong)(fx->d).nd;
  iVar4 = 1;
  iVar6 = 1;
  if (uVar8 != 0) {
    uVar9 = 0;
    do {
      iVar6 = iVar6 * (fx->d).d[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  uVar8 = (ulong)(dEdf->d).nd;
  if (uVar8 != 0) {
    iVar4 = 1;
    uVar9 = 0;
    do {
      iVar4 = iVar4 * (dEdf->d).d[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  uVar5 = iVar4 * (dEdf->d).bd;
  if (iVar6 * (fx->d).bd == uVar5) {
    uVar8 = (ulong)(dEdxi->d).nd;
    iVar4 = 1;
    if (uVar8 != 0) {
      uVar9 = 0;
      do {
        iVar4 = iVar4 * (dEdxi->d).d[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
    uVar7 = iVar4 * (dEdxi->d).bd;
    if (uVar7 == uVar5) {
      if ((ulong)uVar7 != 0) {
        pfVar1 = fx->v;
        pfVar2 = dEdf->v;
        pfVar3 = dEdxi->v;
        uVar8 = 0;
        do {
          pfVar3[uVar8] =
               (float)((uint)pfVar2[uVar8] & -(uint)(pfVar1[uVar8] != 0.0)) + pfVar3[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar7 != uVar8);
      }
      return;
    }
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<cnn::FRectifyBackward, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>, Functor = Eigen::internal::add_assign_op<float, float>]"
                 );
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                "Eigen::CwiseBinaryOp<cnn::FRectifyBackward, const Eigen::Map<Eigen::Matrix<float, -1, 1>>, const Eigen::Map<Eigen::Matrix<float, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = cnn::FRectifyBackward, Lhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>, Rhs = const Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
               );
}

Assistant:

void Rectify::backward_impl(const vector<const Tensor*>& xs,
                         const Tensor& fx,
                         const Tensor& dEdf,
                         unsigned i,
                         Tensor& dEdxi) const {
#if HAVE_CUDA
  gpu::vrelu_backward(fx.d.size(), fx.v, dEdf.v, dEdxi.v);
#else
  dEdxi.vec() += fx.vec().binaryExpr(dEdf.vec(), FRectifyBackward());
#endif
}